

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

int GetIArg(int *i,int argc,char **argv)

{
  int iVar1;
  string errstr;
  string str;
  size_t *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  int *in_stack_ffffffffffffffb8;
  string local_38 [56];
  
  GetNextArg_abi_cxx11_
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  iVar1 = std::__cxx11::stoi(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  std::__cxx11::string::~string(local_38);
  return iVar1;
}

Assistant:

int GetIArg(int & i, int argc, char ** argv)
{   
    std::string str = GetNextArg(i, argc, argv);
    try {

        return stoi(str);
    }
    catch(...)
    {
        std::string errstr("Cannot convert to int: ");
        errstr += str;
        throw std::runtime_error(errstr);
    }
}